

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O1

void floor1_pack(vorbis_info_floor *i,oggpack_buffer *opb)

{
  int iVar1;
  ogg_uint32_t v;
  long lVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  iVar1 = *(int *)((long)i + 0x348);
  oggpack_write(opb,(long)*i,5);
  if (*i < 1) {
    iVar5 = -1;
  }
  else {
    iVar5 = -1;
    lVar3 = 0;
    do {
      oggpack_write(opb,(long)*(int *)((long)i + lVar3 * 4 + 4),4);
      iVar7 = *(int *)((long)i + lVar3 * 4 + 4);
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
      iVar5 = iVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 < *i);
  }
  if (-1 < iVar5) {
    lVar3 = (long)i + 0x140;
    uVar6 = 0;
    do {
      oggpack_write(opb,(long)*(int *)((long)i + uVar6 * 4 + 0x80) - 1,3);
      oggpack_write(opb,(long)*(int *)((long)i + uVar6 * 4 + 0xc0),2);
      if (*(int *)((long)i + uVar6 * 4 + 0xc0) != 0) {
        oggpack_write(opb,(long)*(int *)((long)i + uVar6 * 4 + 0x100),8);
      }
      if (*(int *)((long)i + uVar6 * 4 + 0xc0) != 0x1f) {
        lVar2 = 0;
        do {
          oggpack_write(opb,(long)*(int *)(lVar3 + lVar2 * 4) + 1,8);
          lVar2 = lVar2 + 1;
        } while (lVar2 < 1 << (*(byte *)((long)i + uVar6 * 4 + 0xc0) & 0x1f));
      }
      uVar6 = uVar6 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar6 != iVar5 + 1);
  }
  oggpack_write(opb,(long)*(int *)((long)i + 0x340) - 1,2);
  v = iVar1 - 1;
  iVar1 = ov_ilog(v);
  oggpack_write(opb,(long)iVar1,4);
  iVar1 = ov_ilog(v);
  if (0 < *i) {
    lVar3 = 0;
    iVar5 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + *(int *)((long)i + (long)*(int *)((long)i + lVar3 * 4 + 4) * 4 + 0x80);
      if (iVar5 < iVar7) {
        piVar4 = (int *)((long)i + (long)iVar5 * 4 + 0x34c);
        do {
          oggpack_write(opb,(long)*piVar4,iVar1);
          piVar4 = piVar4 + 1;
          iVar5 = iVar5 + 1;
        } while (iVar7 != iVar5);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < *i);
  }
  return;
}

Assistant:

static void floor1_pack (vorbis_info_floor *i,oggpack_buffer *opb){
  vorbis_info_floor1 *info=(vorbis_info_floor1 *)i;
  int j,k;
  int count=0;
  int rangebits;
  int maxposit=info->postlist[1];
  int maxclass=-1;

  /* save out partitions */
  oggpack_write(opb,info->partitions,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    oggpack_write(opb,info->partitionclass[j],4); /* only 0 to 15 legal */
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* save out partition classes */
  for(j=0;j<maxclass+1;j++){
    oggpack_write(opb,info->class_dim[j]-1,3); /* 1 to 8 */
    oggpack_write(opb,info->class_subs[j],2); /* 0 to 3 */
    if(info->class_subs[j])oggpack_write(opb,info->class_book[j],8);
    for(k=0;k<(1<<info->class_subs[j]);k++)
      oggpack_write(opb,info->class_subbook[j][k]+1,8);
  }

  /* save out the post list */
  oggpack_write(opb,info->mult-1,2);     /* only 1,2,3,4 legal now */
  /* maxposit cannot legally be less than 1; this is encode-side, we
     can assume our setup is OK */
  oggpack_write(opb,ov_ilog(maxposit-1),4);
  rangebits=ov_ilog(maxposit-1);

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]];
    for(;k<count;k++)
      oggpack_write(opb,info->postlist[k+2],rangebits);
  }
}